

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O2

byte_view __thiscall winmd::reader::database::get_blob(database *this,uint32_t index)

{
  byte *pbVar1;
  byte_view bVar2;
  byte_view view;
  
  byte_view::seek(&view,index + 0x650);
  pbVar1 = byte_view::as<unsigned_char>(&view,0);
  bVar2 = (byte_view)
          (*(code *)(&DAT_0016542c + *(int *)(&DAT_0016542c + (ulong)(*pbVar1 >> 5) * 4)))();
  return bVar2;
}

Assistant:

byte_view get_blob(uint32_t const index) const
        {
            auto view = m_blobs.seek(index);
            auto initial_byte = view.as<uint8_t>();
            uint32_t blob_size_bytes{};

            switch (initial_byte >> 5)
            {
            case 0:
            case 1:
            case 2:
            case 3:
                blob_size_bytes = 1;
                initial_byte &= 0x7f;
                break;

            case 4:
            case 5:
                blob_size_bytes = 2;
                initial_byte &= 0x3f;
                break;

            case 6:
                blob_size_bytes = 4;
                initial_byte &= 0x1f;
                break;

            default:
                impl::throw_invalid("Invalid blob encoding");
            }

            uint32_t blob_size{ initial_byte };

            for (auto&& byte : view.sub(1, blob_size_bytes - 1))
            {
                blob_size = (blob_size << 8) + byte;
            }

            return { view.sub(blob_size_bytes, blob_size) };
        }